

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::javanano::PrimitiveTypeName_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,JavaType type)

{
  LogMessage *other;
  char *__s;
  LogFinisher local_49;
  LogMessage local_48;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
  case 7:
    __s = "int";
    break;
  case 1:
    __s = "long";
    break;
  case 2:
    __s = "float";
    break;
  case 3:
    __s = "double";
    break;
  case 4:
    __s = "boolean";
    break;
  case 5:
    __s = "java.lang.String";
    break;
  case 6:
    __s = "byte[]";
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_helpers.cc"
               ,0x167);
    other = internal::LogMessage::operator<<(&local_48,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  case 8:
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string PrimitiveTypeName(JavaType type) {
  switch (type) {
    case JAVATYPE_INT    : return "int";
    case JAVATYPE_LONG   : return "long";
    case JAVATYPE_FLOAT  : return "float";
    case JAVATYPE_DOUBLE : return "double";
    case JAVATYPE_BOOLEAN: return "boolean";
    case JAVATYPE_STRING : return "java.lang.String";
    case JAVATYPE_BYTES  : return "byte[]";
    case JAVATYPE_ENUM   : return "int";
    case JAVATYPE_MESSAGE: return "";

    // No default because we want the compiler to complain if any new
    // JavaTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}